

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int rar_br_preparation(archive_read *a,rar_br *br)

{
  uchar *puVar1;
  rar *rar;
  rar_br *br_local;
  archive_read *a_local;
  
  if (0 < *(long *)((long)a->format->data + 0xa0)) {
    puVar1 = (uchar *)rar_read_ahead(a,1,&br->avail_in);
    br->next_in = puVar1;
    if (br->next_in == (uchar *)0x0) {
      archive_set_error(&a->archive,0x54,"Truncated RAR file data");
      return -0x1e;
    }
    if (br->cache_avail == 0) {
      rar_br_fillup(a,br);
    }
  }
  return 0;
}

Assistant:

static int
rar_br_preparation(struct archive_read *a, struct rar_br *br)
{
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->bytes_remaining > 0) {
    br->next_in = rar_read_ahead(a, 1, &(br->avail_in));
    if (br->next_in == NULL) {
      archive_set_error(&a->archive,
          ARCHIVE_ERRNO_FILE_FORMAT,
          "Truncated RAR file data");
      return (ARCHIVE_FATAL);
    }
    if (br->cache_avail == 0)
      (void)rar_br_fillup(a, br);
  }
  return (ARCHIVE_OK);
}